

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.h
# Opt level: O0

void __thiscall
flow::
ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
::~ConstantValue(ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
                 *this)

{
  ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
  *this_local;
  
  ~ConstantValue(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

ConstantValue(const T& value, const std::string& name = "")
      : Constant(Ty, name), value_(value) {}